

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeEventDestroy(ze_event_handle_t hEvent)

{
  _ze_event_handle_t *_key;
  ze_pfnEventDestroy_t pfnDestroy;
  dditable_t *dditable;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  
  if (*(code **)(*(long *)(hEvent + 8) + 0x4a0) == (code *)0x0) {
    hEvent_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_event_handle_t **)hEvent;
    hEvent_local._4_4_ = (**(code **)(*(long *)(hEvent + 8) + 0x4a0))(_key);
    if (hEvent_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_event_handle_t_*>,__ze_event_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_event_handle_t_*>,__ze_event_handle_t_*> *)
                 (context + 0x1e0),_key);
    }
  }
  return hEvent_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventDestroy(
        ze_event_handle_t hEvent                        ///< [in][release] handle of event object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_object_t*>( hEvent )->dditable;
        auto pfnDestroy = dditable->ze.Event.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEvent = reinterpret_cast<ze_event_object_t*>( hEvent )->handle;

        // forward to device-driver
        result = pfnDestroy( hEvent );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_event_factory.release( hEvent );

        return result;
    }